

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O3

int equal_trip(trip_t *a,trip_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->route_id,b->route_id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->service_id,b->service_id);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->id,b->id);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->headsign,b->headsign);
        uVar2 = uVar3;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->short_name,b->short_name);
          if (iVar1 == 0) {
            iVar1 = strcmp(a->block_id,b->block_id);
            if (iVar1 == 0) {
              iVar1 = strcmp(a->shape_id,b->shape_id);
              if (((iVar1 == 0) && (a->direction_id == b->direction_id)) &&
                 (a->wheelchair_accessible == b->wheelchair_accessible)) {
                uVar2 = (uint)(a->bikes_allowed == b->bikes_allowed);
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_trip(const trip_t *a, const trip_t *b) {
    return (!strcmp(a->route_id, b->route_id) &&
             !strcmp(a->service_id, b->service_id) &&
             !strcmp(a->id, b->id) &&
             !strcmp(a->headsign, b->headsign) &&
             !strcmp(a->short_name, b->short_name) &&
             !strcmp(a->block_id, b->block_id) &&
             !strcmp(a->shape_id, b->shape_id) &&
             a->direction_id == b->direction_id &&
             a->wheelchair_accessible == b->wheelchair_accessible &&
             a->bikes_allowed == b->bikes_allowed);
}